

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulation.cpp
# Opt level: O2

bool __thiscall
TRM::Triangulation::check_intersection
          (Triangulation *this,Edge *left,Edge *right,ActiveEdgeList *ael,Vertex **current)

{
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *paVar1;
  float fVar2;
  vec2 vVar3;
  bool bVar4;
  VertexList *pVVar5;
  Edge *v;
  Edge *ael_00;
  Vertex **ppVVar6;
  Vertex **current_00;
  Edge *pEVar7;
  vec2 p;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 local_50;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_4c;
  Edge *local_48;
  Edge *local_40;
  ActiveEdgeList *local_38;
  
  if (right == (Edge *)0x0 || left == (Edge *)0x0) {
    return false;
  }
  current_00 = current;
  bVar4 = Edge::intersect(left,right,(vec2 *)&local_50);
  if (((!bVar4) ||
      (ael_00 = (Edge *)(ulong)((uint)local_50 & 0x7fffffff),
      ((uint)local_50 & 0x7fffffff) == 0x7f800000)) ||
     (((uint)aStack_4c & 0x7fffffff) == 0x7f800000)) {
    bVar4 = intersect_pair_edge(this,left,right,ael,current);
    return bVar4;
  }
  ppVVar6 = current;
  local_38 = ael;
  while ((pEVar7 = (Edge *)*ppVVar6, pEVar7 != (Edge *)0x0 &&
         (bVar4 = VertexCompare::Compare((vec2 *)&local_50,(vec2 *)&pEVar7->right_poly_prev), bVar4)
         )) {
    ppVVar6 = &pEVar7->top;
  }
  v = (Edge *)left->top;
  if ((local_50.x == (((vec2 *)&v->right_poly_prev)->field_0).x) &&
     (!NAN(local_50.x) && !NAN((((vec2 *)&v->right_poly_prev)->field_0).x))) {
    paVar1 = &((vec2 *)&v->right_poly_prev)->field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_00115208;
  }
  v = (Edge *)left->bottom;
  if ((local_50.x == (((vec2 *)&v->right_poly_prev)->field_0).x) &&
     (!NAN(local_50.x) && !NAN((((vec2 *)&v->right_poly_prev)->field_0).x))) {
    paVar1 = &((vec2 *)&v->right_poly_prev)->field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_00115208;
  }
  v = (Edge *)right->top;
  if ((local_50.x == (((vec2 *)&v->right_poly_prev)->field_0).x) &&
     (!NAN(local_50.x) && !NAN((((vec2 *)&v->right_poly_prev)->field_0).x))) {
    paVar1 = &((vec2 *)&v->right_poly_prev)->field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_00115208;
  }
  v = (Edge *)right->bottom;
  if ((local_50.x == (((vec2 *)&v->right_poly_prev)->field_0).x) &&
     (!NAN(local_50.x) && !NAN((((vec2 *)&v->right_poly_prev)->field_0).x))) {
    paVar1 = &((vec2 *)&v->right_poly_prev)->field_1;
    if ((aStack_4c.y == paVar1->y) && (!NAN(aStack_4c.y) && !NAN(paVar1->y))) goto LAB_00115208;
  }
  for (; local_48 = pEVar7, pEVar7 != (Edge *)0x0; pEVar7 = (Edge *)pEVar7->top) {
    bVar4 = VertexCompare::Compare((vec2 *)&local_50,(vec2 *)&pEVar7->right_poly_prev);
    if (!bVar4) {
      pVVar5 = (VertexList *)&pEVar7->bottom;
      goto LAB_00115153;
    }
  }
  pVVar5 = &this->mesh_;
LAB_00115153:
  while ((ael_00 = (Edge *)(pVVar5->super_LinkedList<TRM::Vertex>).head, ael_00 != (Edge *)0x0 &&
         (bVar4 = VertexCompare::Compare((vec2 *)&ael_00->right_poly_prev,(vec2 *)&local_50), bVar4)
         )) {
    pVVar5 = (VertexList *)&ael_00->bottom;
    local_48 = ael_00;
  }
  if (local_48 != (Edge *)0x0) {
    if ((*(float *)&local_48->right_poly_prev == local_50.x) &&
       (!NAN(*(float *)&local_48->right_poly_prev) && !NAN(local_50.x))) {
      fVar2 = *(float *)((long)&local_48->right_poly_prev + 4);
      if ((fVar2 == aStack_4c.y) && (v = local_48, !NAN(fVar2) && !NAN(aStack_4c.y)))
      goto LAB_00115208;
    }
  }
  if ((((ael_00 == (Edge *)0x0) ||
       (fVar2 = (((vec2 *)&ael_00->right_poly_prev)->field_0).x, fVar2 != local_50.x)) ||
      (NAN(fVar2) || NAN(local_50.x))) ||
     ((fVar2 = (((vec2 *)&ael_00->right_poly_prev)->field_1).y, fVar2 != aStack_4c.y ||
      (v = ael_00, NAN(fVar2) || NAN(aStack_4c.y))))) {
    local_40 = ael_00;
    v = (Edge *)ObjectHeap::Allocate<TRM::Vertex,glm::vec<2,float,(glm::qualifier)0>&>
                          (&this->heap_,(vec<2,_float,_(glm::qualifier)0> *)&local_50);
    vVar3.field_1.y = aStack_4c.y;
    vVar3.field_0.x = local_50.x;
    *(vec2 *)&v->right_poly_prev = vVar3;
    ael_00 = local_40;
    VertexList::insert(&this->mesh_,(Vertex *)v,(Vertex *)local_48,(Vertex *)local_40);
  }
LAB_00115208:
  ActiveEdgeList::rewind(local_38,(FILE *)current);
  split_edge(this,left,(Vertex *)v,(ActiveEdgeList *)ael_00,current_00);
  split_edge(this,right,(Vertex *)v,(ActiveEdgeList *)ael_00,current_00);
  return true;
}

Assistant:

bool Triangulation::check_intersection(Edge* left, Edge* right,
                                       ActiveEdgeList* ael, Vertex** current) {
  if (!left || !right) {
    return false;
  }

  glm::vec2 p;

  if (left->intersect(right, &p) && !glm::isinf(p.x) && !glm::isinf(p.y)) {
    Vertex* v;
    Vertex* top = *current;

    // the vertex in mesh is sorted, so walk to prev can find latest top point
    while (top && VertexCompare::Compare(p, top->point)) {
      top = top->prev;
    }

    if (p == left->top->point) {
      v = left->top;
    } else if (p == left->bottom->point) {
      v = left->bottom;
    } else if (p == right->top->point) {
      v = right->top;
    } else if (p == right->bottom->point) {
      v = right->bottom;
    } else {
      // intersect point is between start and end point
      // need to insert new vertex
      auto prev = top;
      while (prev && VertexCompare::Compare(p, prev->point)) {
        prev = prev->prev;
      }

      auto next = prev ? prev->next : mesh_.head;
      while (next && VertexCompare::Compare(next->point, p)) {
        prev = next;
        next = next->next;
      }

      // check if point is already in mesh
      if (prev && prev->point == p) {
        v = prev;
      } else if (next && next->point == p) {
        v = next;
      } else {
        v = heap_.Allocate<Vertex>(p);
        v->point = p;

        mesh_.insert(v, prev, next);
      }
    }
    ael->rewind(current, top ? top : v);

    split_edge(left, v, ael, current);
    split_edge(right, v, ael, current);
    return true;
  }

  return intersect_pair_edge(left, right, ael, current);
}